

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
pstore::small_vector<unsigned_char,128ul>::assign<unsigned_char_const*>
          (small_vector<unsigned_char,128ul> *this,uchar *first,uchar *last)

{
  ulong new_elements;
  ulong uVar1;
  iterator __position;
  
  if (*(long *)(this + 0x90) != *(long *)(this + 0x88)) {
    *(long *)(this + 0x90) = *(long *)(this + 0x88);
  }
  *(undefined8 *)this = 0;
  *(small_vector<unsigned_char,128ul> **)(this + 0xa0) = this + 8;
  if (first != last) {
    do {
      uVar1 = *(ulong *)this;
      new_elements = uVar1 + 1;
      if (new_elements < 0x81) {
        (this + 8)[uVar1] = (small_vector<unsigned_char,128ul>)*first;
      }
      else {
        if (uVar1 < 0x81) {
          small_vector<unsigned_char,_128UL>::switch_to_big
                    ((small_vector<unsigned_char,_128UL> *)this,new_elements);
        }
        __position._M_current = *(uchar **)(this + 0x90);
        if (__position._M_current == *(uchar **)(this + 0x98)) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)(this + 0x88),__position
                     ,first);
        }
        else {
          *__position._M_current = *first;
          *(long *)(this + 0x90) = *(long *)(this + 0x90) + 1;
        }
        *(undefined8 *)(this + 0xa0) = *(undefined8 *)(this + 0x88);
      }
      *(ulong *)this = new_elements;
      first = (uchar *)((small_vector<unsigned_char,128ul> *)first + 1);
    } while (first != last);
  }
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::assign (InputIt first, InputIt last) {
        this->clear ();
        for (; first != last; ++first) {
            this->push_back (*first);
        }
    }